

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O1

int set_file_dostime(int argc,char **argv)

{
  int iVar1;
  ulonglong uVar2;
  ulonglong uVar3;
  ulonglong uVar4;
  int iVar5;
  
  iVar5 = 0;
  uVar2 = strtoull(*argv,(char **)0x0,10);
  uVar3 = strtoull(argv[1],(char **)0x0,10);
  uVar4 = strtoull(argv[2],(char **)0x0,10);
  iVar1 = zip_file_set_dostime(za,uVar2,(uint)uVar3 & 0xffff,(uint)uVar4 & 0xffff,0);
  if (iVar1 < 0) {
    set_file_dostime_cold_1();
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int
set_file_dostime(int argc, char *argv[]) {
    /* set file last modification time (mtime) directly */
    zip_uint16_t dostime, dosdate;
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    dostime = (zip_uint16_t)strtoull(argv[1], NULL, 10);
    dosdate = (zip_uint16_t)strtoull(argv[2], NULL, 10);
    if (zip_file_set_dostime(za, idx, dostime, dosdate, 0) < 0) {
	fprintf(stderr, "can't set file dostime at index '%" PRIu64 "' to '%d'/'%d': %s\n", idx, (int)dostime, (int)dosdate, zip_strerror(za));
	return -1;
    }
    return 0;
}